

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_NtkSuppSizeTest(Au_Ntk_t *p)

{
  int iVar1;
  Au_Obj_t *pObj;
  uint uVar2;
  int i;
  
  uVar2 = 0;
  for (i = 0; i < (p->vObjs).nSize; i = i + 1) {
    pObj = Au_NtkObjI(p,i);
    if ((~*(ulong *)pObj & 0x700000000) == 0) {
      iVar1 = Au_ObjSuppSize(pObj);
      uVar2 = uVar2 + (iVar1 < 0x11);
    }
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar2,(ulong)(uint)p->nObjs[7]);
  return uVar2;
}

Assistant:

int Au_NtkSuppSizeTest( Au_Ntk_t * p )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    Au_NtkForEachObj( p, pObj, i )
        if ( Au_ObjIsNode(pObj) )
            Counter += (Au_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Au_NtkNodeNum(p) );
    return Counter;
}